

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play_song.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  uint8_t song_len;
  int baud;
  RobotModel model;
  string port;
  uint8_t notes [9];
  float durations [9];
  Create robot;
  uchar local_1ee [6];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  long local_1d8;
  char *local_1c8 [2];
  char local_1b8 [16];
  float local_1a8 [2];
  undefined1 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined4 local_178;
  undefined1 *local_170 [2];
  undefined1 local_160 [320];
  
  local_1d8 = ___cxa_end_catch;
  local_1e8 = CONCAT44(create::RobotModel::CREATE_2._4_4_,(undefined4)create::RobotModel::CREATE_2);
  uStack_1e0 = CONCAT44(uRam00000000001090ec,_Init);
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"/dev/ttyUSB0","");
  local_1ee[2] = '\0';
  local_1ee[3] = 0xc2;
  local_1ee[4] = '\x01';
  local_1ee[5] = '\0';
  pcVar4 = "Running driver for Create 2";
  if (1 < argc) {
    std::__cxx11::string::string((string *)local_170,argv[1],(allocator *)&local_198);
    iVar2 = std::__cxx11::string::compare((char *)local_170);
    if (local_170[0] != local_160) {
      operator_delete(local_170[0]);
    }
    if (iVar2 == 0) {
      local_1d8 = std::cout;
      local_1e8 = create::RobotModel::CREATE_1;
      uStack_1e0 = ___ostream_insert<char,std::char_traits<char>>;
      local_1ee[2] = '\0';
      local_1ee[3] = 0xe1;
      local_1ee[4] = '\0';
      local_1ee[5] = '\0';
      pcVar4 = "Running driver for Create 1";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  create::Create::Create((Create *)local_170,1);
  cVar1 = create::Create::connect((string *)local_170,(int *)local_1c8);
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to connect to robot on port ",0x23);
    pcVar4 = local_1c8[0];
    if (local_1c8[0] == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1090c8);
    }
    else {
      sVar3 = strlen(local_1c8[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    iVar2 = 1;
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Connected to robot",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    local_198 = CONCAT44(local_198._4_4_,3);
    create::Create::setMode((CreateMode *)local_170);
    local_1ee[1] = 9;
    local_1a8[0] = 4.2658225e-08;
    local_1a8[1] = 0.00068365375;
    local_1a0 = 0x37;
    local_188 = 0x3f0000003e000000;
    uStack_180 = 0x3e0000003ec00000;
    local_198 = 0x3f0000003f000000;
    uStack_190 = 0x3ec000003f000000;
    local_178 = 0x3f800000;
    local_1ee[0] = '\0';
    create::Create::defineSong((uchar *)local_170,local_1ee,local_1ee + 1,local_1a8);
    usleep(1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Playing a song!",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    local_1ee[0] = '\0';
    create::Create::playSong((uchar *)local_170);
    usleep(4500000);
    create::Create::disconnect();
    iVar2 = 0;
  }
  create::Create::~Create((Create *)local_170);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0]);
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  // Useful note defintions
  const uint8_t G = 55;
  const uint8_t AS = 58;
  const uint8_t DS = 51;
  const float half = 1.0f;
  const float quarter = 0.5f;
  const float dotted_eigth = 0.375f;
  const float sixteenth = 0.125f;

  // Define a song
  const uint8_t song_len = 9;
  const uint8_t notes[song_len] = { G, G, G, DS, AS, G, DS, AS, G };
  const float durations[song_len] = { quarter, quarter, quarter, dotted_eigth, sixteenth, quarter, dotted_eigth, sixteenth, half };
  robot.defineSong(0, song_len, notes, durations);

  // Sleep to provide time for song to register
  usleep(1000000);

  std::cout << "Playing a song!" << std::endl;

  // Request to play the song we just defined
  robot.playSong(0);

  // Expect the song to take about four seconds
  usleep(4500000);

  // Call disconnect to avoid leaving robot in Full mode
  robot.disconnect();

  return 0;
}